

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O0

void __thiscall
Annotator_autoIdOnOutOfDateBuild_Test::TestBody(Annotator_autoIdOnOutOfDateBuild_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  char *pcVar4;
  element_type *peVar5;
  element_type *peVar6;
  element_type *peVar7;
  element_type *peVar8;
  element_type *peVar9;
  AssertHelper local_1628 [8];
  Message local_1620 [15];
  allocator<char> local_1611;
  string local_1610 [32];
  shared_ptr<libcellml::Component> local_15f0;
  shared_ptr<libcellml::Variable> local_15e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15d0;
  undefined1 local_15b0 [8];
  AssertionResult gtest_ar_38;
  Message local_1598 [15];
  allocator<char> local_1589;
  string local_1588 [32];
  shared_ptr<libcellml::Component> local_1568;
  shared_ptr<libcellml::Variable> local_1558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1548;
  undefined1 local_1528 [8];
  AssertionResult gtest_ar_37;
  Message local_1510 [15];
  allocator<char> local_1501;
  string local_1500 [32];
  shared_ptr<libcellml::Component> local_14e0;
  shared_ptr<libcellml::Variable> local_14d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14c0;
  undefined1 local_14a0 [8];
  AssertionResult gtest_ar_36;
  string local_1488 [39];
  allocator<char> local_1461;
  string local_1460 [32];
  shared_ptr<libcellml::Component> local_1440;
  shared_ptr<libcellml::Variable> local_1430;
  AssertHelper local_1420 [8];
  Message local_1418 [8];
  shared_ptr<libcellml::Units> local_1410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1400;
  undefined1 local_13e0 [8];
  AssertionResult gtest_ar_35;
  Message local_13c8 [8];
  shared_ptr<libcellml::Units> local_13c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13b0;
  undefined1 local_1390 [8];
  AssertionResult gtest_ar_34;
  Message local_1378 [8];
  shared_ptr<libcellml::Units> local_1370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1360;
  undefined1 local_1340 [8];
  AssertionResult gtest_ar_33;
  string local_1328 [32];
  shared_ptr<libcellml::Units> local_1308;
  AssertHelper local_12f8 [8];
  Message local_12f0 [8];
  shared_ptr<libcellml::Units> local_12e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12d8;
  undefined1 local_12b8 [8];
  AssertionResult gtest_ar_32;
  Message local_12a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1298;
  undefined1 local_1278 [8];
  AssertionResult gtest_ar_31;
  Message local_1260 [8];
  shared_ptr<libcellml::Units> local_1258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1248;
  undefined1 local_1228 [8];
  AssertionResult gtest_ar_30;
  string local_1210 [32];
  shared_ptr<libcellml::Units> local_11f0;
  shared_ptr<libcellml::Units> local_11e0;
  undefined1 local_11d0 [8];
  UnitsItemPtr unitsItem;
  Message local_11b8 [15];
  allocator<char> local_11a9;
  string local_11a8 [32];
  shared_ptr<libcellml::Component> local_1188;
  shared_ptr<libcellml::Reset> local_1178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1168;
  undefined1 local_1148 [8];
  AssertionResult gtest_ar_29;
  Message local_1130 [15];
  allocator<char> local_1121;
  string local_1120 [32];
  shared_ptr<libcellml::Component> local_1100;
  shared_ptr<libcellml::Reset> local_10f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10e0;
  undefined1 local_10c0 [8];
  AssertionResult gtest_ar_28;
  Message local_10a8 [15];
  allocator<char> local_1099;
  string local_1098 [32];
  shared_ptr<libcellml::Component> local_1078;
  shared_ptr<libcellml::Reset> local_1068;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1058;
  undefined1 local_1038 [8];
  AssertionResult gtest_ar_27;
  string local_1020 [39];
  allocator<char> local_ff9;
  string local_ff8 [32];
  shared_ptr<libcellml::Component> local_fd8;
  shared_ptr<libcellml::Reset> local_fc8;
  AssertHelper local_fb8 [8];
  Message local_fb0 [15];
  allocator<char> local_fa1;
  string local_fa0 [32];
  shared_ptr<libcellml::Component> local_f80;
  shared_ptr<libcellml::Reset> local_f70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f60;
  undefined1 local_f40 [8];
  AssertionResult gtest_ar_26;
  Message local_f28 [15];
  allocator<char> local_f19;
  string local_f18 [32];
  shared_ptr<libcellml::Component> local_ef8;
  shared_ptr<libcellml::Reset> local_ee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ed8;
  undefined1 local_eb8 [8];
  AssertionResult gtest_ar_25;
  Message local_ea0 [15];
  allocator<char> local_e91;
  string local_e90 [32];
  shared_ptr<libcellml::Component> local_e70;
  shared_ptr<libcellml::Reset> local_e60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e50;
  undefined1 local_e30 [8];
  AssertionResult gtest_ar_24;
  string local_e18 [39];
  allocator<char> local_df1;
  string local_df0 [32];
  shared_ptr<libcellml::Component> local_dd0;
  shared_ptr<libcellml::Reset> local_dc0;
  AssertHelper local_db0 [8];
  Message local_da8 [15];
  allocator<char> local_d99;
  string local_d98 [32];
  shared_ptr<libcellml::Component> local_d78;
  shared_ptr<libcellml::Reset> local_d68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d58;
  undefined1 local_d38 [8];
  AssertionResult gtest_ar_23;
  Message local_d20 [15];
  allocator<char> local_d11;
  string local_d10 [32];
  shared_ptr<libcellml::Component> local_cf0;
  shared_ptr<libcellml::Reset> local_ce0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cd0;
  undefined1 local_cb0 [8];
  AssertionResult gtest_ar_22;
  Message local_c98 [15];
  allocator<char> local_c89;
  string local_c88 [32];
  shared_ptr<libcellml::Component> local_c68;
  shared_ptr<libcellml::Reset> local_c58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c48;
  undefined1 local_c28 [8];
  AssertionResult gtest_ar_21;
  string local_c10 [39];
  allocator<char> local_be9;
  string local_be8 [32];
  shared_ptr<libcellml::Component> local_bc8;
  shared_ptr<libcellml::Reset> local_bb8;
  AssertHelper local_ba8 [8];
  Message local_ba0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b98;
  undefined1 local_b78 [8];
  AssertionResult gtest_ar_20;
  Message local_b60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b58;
  undefined1 local_b38 [8];
  AssertionResult gtest_ar_19;
  Message local_b20 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b18;
  undefined1 local_af8 [8];
  AssertionResult gtest_ar_18;
  string local_ae0 [32];
  AssertHelper local_ac0 [8];
  Message local_ab8 [8];
  shared_ptr<libcellml::Variable> local_ab0;
  shared_ptr<libcellml::Variable> local_aa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a90;
  undefined1 local_a70 [8];
  AssertionResult gtest_ar_17;
  Message local_a58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a50;
  undefined1 local_a30 [8];
  AssertionResult gtest_ar_16;
  Message local_a18 [8];
  shared_ptr<libcellml::Variable> local_a10;
  shared_ptr<libcellml::Variable> local_a00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f0;
  undefined1 local_9d0 [8];
  AssertionResult gtest_ar_15;
  string local_9b8 [32];
  shared_ptr<libcellml::Variable> local_998;
  shared_ptr<libcellml::Variable> local_988;
  allocator<char> local_971;
  string local_970 [39];
  allocator<char> local_949;
  string local_948 [32];
  shared_ptr<libcellml::Component> local_928;
  shared_ptr<libcellml::Variable> local_918;
  shared_ptr<libcellml::Variable> local_908;
  allocator<char> local_8f1;
  string local_8f0 [39];
  allocator<char> local_8c9;
  string local_8c8 [32];
  shared_ptr<libcellml::Component> local_8a8;
  string local_898 [16];
  undefined1 local_888 [8];
  VariablePairPtr mapping;
  Message local_870 [15];
  allocator<char> local_861;
  string local_860 [32];
  shared_ptr<libcellml::Component> local_840;
  shared_ptr<libcellml::ImportSource> local_830;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_820;
  undefined1 local_800 [8];
  AssertionResult gtest_ar_14;
  Message local_7e8 [15];
  allocator<char> local_7d9;
  string local_7d8 [32];
  shared_ptr<libcellml::Component> local_7b8;
  shared_ptr<libcellml::ImportSource> local_7a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_798;
  undefined1 local_778 [8];
  AssertionResult gtest_ar_13;
  Message local_760 [15];
  allocator<char> local_751;
  string local_750 [32];
  shared_ptr<libcellml::Component> local_730;
  shared_ptr<libcellml::ImportSource> local_720;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_710;
  undefined1 local_6f0 [8];
  AssertionResult gtest_ar_12;
  string local_6d8 [39];
  allocator<char> local_6b1;
  string local_6b0 [32];
  shared_ptr<libcellml::Component> local_690;
  shared_ptr<libcellml::ImportSource> local_680;
  AssertHelper local_670 [8];
  Message local_668 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  undefined1 local_640 [8];
  AssertionResult gtest_ar_11;
  Message local_628 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620;
  undefined1 local_600 [8];
  AssertionResult gtest_ar_10;
  Message local_5e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  undefined1 local_5c0 [8];
  AssertionResult gtest_ar_9;
  string local_5a8 [32];
  AssertHelper local_588 [8];
  Message local_580 [8];
  shared_ptr<libcellml::Variable> local_578;
  shared_ptr<libcellml::Variable> local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  undefined1 local_538 [8];
  AssertionResult gtest_ar_8;
  Message local_520 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  undefined1 local_4f8 [8];
  AssertionResult gtest_ar_7;
  Message local_4e0 [8];
  shared_ptr<libcellml::Variable> local_4d8;
  shared_ptr<libcellml::Variable> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  undefined1 local_498 [8];
  AssertionResult gtest_ar_6;
  string local_480 [32];
  shared_ptr<libcellml::Variable> local_460;
  shared_ptr<libcellml::Variable> local_450;
  allocator<char> local_439;
  string local_438 [39];
  allocator<char> local_411;
  string local_410 [32];
  shared_ptr<libcellml::Component> local_3f0;
  shared_ptr<libcellml::Variable> local_3e0;
  shared_ptr<libcellml::Variable> local_3d0;
  allocator<char> local_3b9;
  string local_3b8 [39];
  allocator<char> local_391;
  string local_390 [32];
  shared_ptr<libcellml::Component> local_370;
  string local_360 [16];
  undefined1 local_350 [8];
  VariablePairPtr connection;
  Message local_338 [15];
  allocator<char> local_329;
  string local_328 [32];
  shared_ptr<libcellml::Component> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar_5;
  Message local_2c0 [15];
  allocator<char> local_2b1;
  string local_2b0 [32];
  shared_ptr<libcellml::Component> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  undefined1 local_260 [8];
  AssertionResult gtest_ar_4;
  Message local_248 [15];
  allocator<char> local_239;
  string local_238 [32];
  shared_ptr<libcellml::Component> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_3;
  string local_1d0 [39];
  allocator<char> local_1a9;
  string local_1a8 [32];
  shared_ptr<libcellml::Component> local_188;
  AssertHelper local_178 [8];
  Message local_170 [8];
  shared_ptr<libcellml::Component> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  undefined1 local_138 [8];
  AssertionResult gtest_ar_2;
  Message local_120 [8];
  shared_ptr<libcellml::Component> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_1;
  Message local_d0 [8];
  shared_ptr<libcellml::Component> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  string local_80 [32];
  shared_ptr<libcellml::Component> local_60;
  undefined1 local_50 [8];
  AnnotatorPtr annotator;
  undefined1 local_30 [8];
  ModelPtr model;
  ParserPtr parser;
  Annotator_autoIdOnOutOfDateBuild_Test *this_local;
  
  this_00 = &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  libcellml::Parser::create(SUB81(this_00,0));
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_00);
  libcellml::Parser::parseModel((string *)local_30);
  libcellml::Annotator::create();
  peVar2 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_50);
  libcellml::Annotator::setModel((shared_ptr *)peVar2);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  libcellml::ComponentEntity::component((ulong)&local_60);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_80,"changed",(allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  libcellml::Entity::setId((string *)peVar3);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_60);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  libcellml::ComponentEntity::component((ulong)&local_c8);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_c8);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[8],std::__cxx11::string>
            ((EqHelper<false> *)local_98,"\"changed\"","model->component(0)->id()",
             (char (*) [8])"changed",&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(local_d0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x860,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  peVar2 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_50);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  libcellml::ComponentEntity::component((ulong)&local_118);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_108,(CellmlElementType)peVar2);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_e8,"\"b4da55\"","annotator->assignId(model->component(0))",
             (char (*) [7])"b4da55",&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_118);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar1) {
    testing::Message::Message(local_120);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x861,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  libcellml::ComponentEntity::component((ulong)&local_168);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_168);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_138,"\"b4da55\"","model->component(0)->id()",
             (char (*) [7])"b4da55",&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_168);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(local_170);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
    testing::internal::AssertHelper::AssertHelper
              (local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x862,pcVar4);
    testing::internal::AssertHelper::operator=(local_178,local_170);
    testing::internal::AssertHelper::~AssertHelper(local_178);
    testing::Message::~Message(local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1a8,"component2",&local_1a9);
  libcellml::ComponentEntity::component((string *)&local_188,SUB81(peVar5,0));
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_188);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1d0,"changed",(allocator<char> *)((long)&gtest_ar_3.message_.ptr_ + 7));
  libcellml::ComponentEntity::setEncapsulationId((string *)peVar3);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_3.message_.ptr_ + 7));
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_188);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_238,"component2",&local_239);
  libcellml::ComponentEntity::component((string *)&local_218,SUB81(peVar5,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_218);
  libcellml::ComponentEntity::encapsulationId_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[8],std::__cxx11::string>
            ((EqHelper<false> *)local_1e8,"\"changed\"",
             "model->component(\"component2\")->encapsulationId()",(char (*) [8])"changed",
             &local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_218);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator(&local_239);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar1) {
    testing::Message::Message(local_248);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x865,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(local_248);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  peVar2 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_50);
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2b0,"component2",&local_2b1);
  libcellml::ComponentEntity::component((string *)&local_290,SUB81(peVar5,0));
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_280,(CellmlElementType)peVar2);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_260,"\"b4da56\"",
             "annotator->assignId(model->component(\"component2\"), libcellml::CellmlElementType::COMPONENT_REF)"
             ,(char (*) [7])"b4da56",&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_290);
  std::__cxx11::string::~string(local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
  if (!bVar1) {
    testing::Message::Message(local_2c0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_260);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x866,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,local_2c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(local_2c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_328,"component2",&local_329);
  libcellml::ComponentEntity::component((string *)&local_308,SUB81(peVar5,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_308);
  libcellml::ComponentEntity::encapsulationId_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_2d8,"\"b4da56\"",
             "model->component(\"component2\")->encapsulationId()",(char (*) [7])"b4da56",&local_2f8
            );
  std::__cxx11::string::~string((string *)&local_2f8);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_308);
  std::__cxx11::string::~string(local_328);
  std::allocator<char>::~allocator(&local_329);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
  if (!bVar1) {
    testing::Message::Message(local_338);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &connection.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x867,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &connection.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,local_338);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &connection.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    testing::Message::~Message(local_338);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_390,"component2",&local_391);
  libcellml::ComponentEntity::component((string *)&local_370,SUB81(peVar5,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_370);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3b8,"variable1",&local_3b9);
  libcellml::Component::variable(local_360);
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_410,"component2",&local_411);
  libcellml::ComponentEntity::component((string *)&local_3f0,SUB81(peVar5,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_3f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_438,"variable1",&local_439);
  libcellml::Component::variable((string *)&local_3e0);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_3e0);
  libcellml::Variable::equivalentVariable((ulong)&local_3d0);
  libcellml::VariablePair::create((shared_ptr *)local_350,(shared_ptr *)local_360);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_3d0);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_3e0);
  std::__cxx11::string::~string(local_438);
  std::allocator<char>::~allocator(&local_439);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_3f0);
  std::__cxx11::string::~string(local_410);
  std::allocator<char>::~allocator(&local_411);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_360);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator(&local_3b9);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_370);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator(&local_391);
  std::__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)local_350);
  libcellml::VariablePair::variable1();
  std::__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)local_350);
  libcellml::VariablePair::variable2();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_480,"changed",(allocator<char> *)((long)&gtest_ar_6.message_.ptr_ + 7));
  libcellml::Variable::setEquivalenceConnectionId
            ((shared_ptr *)&local_450,(shared_ptr *)&local_460,local_480);
  std::__cxx11::string::~string(local_480);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_6.message_.ptr_ + 7));
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_460);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_450);
  std::__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)local_350);
  libcellml::VariablePair::variable1();
  std::__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)local_350);
  libcellml::VariablePair::variable2();
  libcellml::Variable::equivalenceConnectionId_abi_cxx11_
            ((shared_ptr *)&local_4b8,(shared_ptr *)&local_4c8);
  testing::internal::EqHelper<false>::Compare<char[8],std::__cxx11::string>
            ((EqHelper<false> *)local_498,"\"changed\"",
             "libcellml::Variable::equivalenceConnectionId(connection->variable1(), connection->variable2())"
             ,(char (*) [8])"changed",&local_4b8);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_4d8);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_4c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_498);
  if (!bVar1) {
    testing::Message::Message(local_4e0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_498);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x86d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,local_4e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(local_4e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_498);
  peVar2 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_50);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_518,(CellmlElementType)peVar2);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_4f8,"\"b4da57\"",
             "annotator->assignId(connection, libcellml::CellmlElementType::CONNECTION)",
             (char (*) [7])"b4da57",&local_518);
  std::__cxx11::string::~string((string *)&local_518);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4f8);
  if (!bVar1) {
    testing::Message::Message(local_520);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_4f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x86e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,local_520);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(local_520);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f8);
  std::__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)local_350);
  libcellml::VariablePair::variable1();
  std::__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)local_350);
  libcellml::VariablePair::variable2();
  libcellml::Variable::equivalenceConnectionId_abi_cxx11_
            ((shared_ptr *)&local_558,(shared_ptr *)&local_568);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_538,"\"b4da57\"",
             "libcellml::Variable::equivalenceConnectionId(connection->variable1(), connection->variable2())"
             ,(char (*) [7])"b4da57",&local_558);
  std::__cxx11::string::~string((string *)&local_558);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_578);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_568);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_538);
  if (!bVar1) {
    testing::Message::Message(local_580);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_538);
    testing::internal::AssertHelper::AssertHelper
              (local_588,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x86f,pcVar4);
    testing::internal::AssertHelper::operator=(local_588,local_580);
    testing::internal::AssertHelper::~AssertHelper(local_588);
    testing::Message::~Message(local_580);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_538);
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_5a8,"changed",(allocator<char> *)((long)&gtest_ar_9.message_.ptr_ + 7));
  libcellml::ComponentEntity::setEncapsulationId((string *)peVar5);
  std::__cxx11::string::~string(local_5a8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_9.message_.ptr_ + 7));
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  libcellml::ComponentEntity::encapsulationId_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[8],std::__cxx11::string>
            ((EqHelper<false> *)local_5c0,"\"changed\"","model->encapsulationId()",
             (char (*) [8])"changed",&local_5e0);
  std::__cxx11::string::~string((string *)&local_5e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5c0);
  if (!bVar1) {
    testing::Message::Message(local_5e8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_5c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x872,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,local_5e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(local_5e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5c0);
  peVar2 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_50);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_620,(CellmlElementType)peVar2);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_600,"\"b4da58\"",
             "annotator->assignId(model, libcellml::CellmlElementType::ENCAPSULATION)",
             (char (*) [7])"b4da58",&local_620);
  std::__cxx11::string::~string((string *)&local_620);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_600);
  if (!bVar1) {
    testing::Message::Message(local_628);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_600);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x873,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,local_628);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(local_628);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_600);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  libcellml::ComponentEntity::encapsulationId_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_640,"\"b4da58\"","model->encapsulationId()",
             (char (*) [7])"b4da58",&local_660);
  std::__cxx11::string::~string((string *)&local_660);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_640);
  if (!bVar1) {
    testing::Message::Message(local_668);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_640);
    testing::internal::AssertHelper::AssertHelper
              (local_670,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x874,pcVar4);
    testing::internal::AssertHelper::operator=(local_670,local_668);
    testing::internal::AssertHelper::~AssertHelper(local_670);
    testing::Message::~Message(local_668);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_640);
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_6b0,"component1",&local_6b1);
  libcellml::ComponentEntity::component((string *)&local_690,SUB81(peVar5,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_690);
  libcellml::ImportedEntity::importSource();
  peVar6 = std::
           __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_680);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_6d8,"changed",(allocator<char> *)((long)&gtest_ar_12.message_.ptr_ + 7));
  libcellml::Entity::setId((string *)peVar6);
  std::__cxx11::string::~string(local_6d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_12.message_.ptr_ + 7));
  std::shared_ptr<libcellml::ImportSource>::~shared_ptr(&local_680);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_690);
  std::__cxx11::string::~string(local_6b0);
  std::allocator<char>::~allocator(&local_6b1);
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_750,"component1",&local_751);
  libcellml::ComponentEntity::component((string *)&local_730,SUB81(peVar5,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_730);
  libcellml::ImportedEntity::importSource();
  std::__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&local_720);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[8],std::__cxx11::string>
            ((EqHelper<false> *)local_6f0,"\"changed\"",
             "model->component(\"component1\")->importSource()->id()",(char (*) [8])"changed",
             &local_710);
  std::__cxx11::string::~string((string *)&local_710);
  std::shared_ptr<libcellml::ImportSource>::~shared_ptr(&local_720);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_730);
  std::__cxx11::string::~string(local_750);
  std::allocator<char>::~allocator(&local_751);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6f0);
  if (!bVar1) {
    testing::Message::Message(local_760);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_6f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x877,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,local_760);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(local_760);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6f0);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_50);
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_7d8,"component1",&local_7d9);
  libcellml::ComponentEntity::component((string *)&local_7b8,SUB81(peVar5,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_7b8);
  libcellml::ImportedEntity::importSource();
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_798);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_778,"\"b4da59\"",
             "annotator->assignId(model->component(\"component1\")->importSource())",
             (char (*) [7])"b4da59",&local_798);
  std::__cxx11::string::~string((string *)&local_798);
  std::shared_ptr<libcellml::ImportSource>::~shared_ptr(&local_7a8);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_7b8);
  std::__cxx11::string::~string(local_7d8);
  std::allocator<char>::~allocator(&local_7d9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_778);
  if (!bVar1) {
    testing::Message::Message(local_7e8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_778);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x878,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,local_7e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(local_7e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_778);
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_860,"component1",&local_861);
  libcellml::ComponentEntity::component((string *)&local_840,SUB81(peVar5,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_840);
  libcellml::ImportedEntity::importSource();
  std::__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&local_830);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_800,"\"b4da59\"",
             "model->component(\"component1\")->importSource()->id()",(char (*) [7])"b4da59",
             &local_820);
  std::__cxx11::string::~string((string *)&local_820);
  std::shared_ptr<libcellml::ImportSource>::~shared_ptr(&local_830);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_840);
  std::__cxx11::string::~string(local_860);
  std::allocator<char>::~allocator(&local_861);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_800);
  if (!bVar1) {
    testing::Message::Message(local_870);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_800);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &mapping.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x879,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &mapping.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,local_870);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &mapping.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    testing::Message::~Message(local_870);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_800);
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_8c8,"component2",&local_8c9);
  libcellml::ComponentEntity::component((string *)&local_8a8,SUB81(peVar5,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_8a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_8f0,"variable2",&local_8f1);
  libcellml::Component::variable(local_898);
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_948,"component2",&local_949);
  libcellml::ComponentEntity::component((string *)&local_928,SUB81(peVar5,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_928);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_970,"variable2",&local_971);
  libcellml::Component::variable((string *)&local_918);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_918);
  libcellml::Variable::equivalentVariable((ulong)&local_908);
  libcellml::VariablePair::create((shared_ptr *)local_888,(shared_ptr *)local_898);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_908);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_918);
  std::__cxx11::string::~string(local_970);
  std::allocator<char>::~allocator(&local_971);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_928);
  std::__cxx11::string::~string(local_948);
  std::allocator<char>::~allocator(&local_949);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_898);
  std::__cxx11::string::~string(local_8f0);
  std::allocator<char>::~allocator(&local_8f1);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_8a8);
  std::__cxx11::string::~string(local_8c8);
  std::allocator<char>::~allocator(&local_8c9);
  std::__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)local_888);
  libcellml::VariablePair::variable1();
  std::__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)local_888);
  libcellml::VariablePair::variable2();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_9b8,"changed",(allocator<char> *)((long)&gtest_ar_15.message_.ptr_ + 7));
  libcellml::Variable::setEquivalenceMappingId
            ((shared_ptr *)&local_988,(shared_ptr *)&local_998,local_9b8);
  std::__cxx11::string::~string(local_9b8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_15.message_.ptr_ + 7));
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_998);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_988);
  std::__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)local_888);
  libcellml::VariablePair::variable1();
  std::__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)local_888);
  libcellml::VariablePair::variable2();
  libcellml::Variable::equivalenceMappingId_abi_cxx11_
            ((shared_ptr *)&local_9f0,(shared_ptr *)&local_a00);
  testing::internal::EqHelper<false>::Compare<char[8],std::__cxx11::string>
            ((EqHelper<false> *)local_9d0,"\"changed\"",
             "libcellml::Variable::equivalenceMappingId(mapping->variable1(), mapping->variable2())"
             ,(char (*) [8])"changed",&local_9f0);
  std::__cxx11::string::~string((string *)&local_9f0);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_a10);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_a00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9d0);
  if (!bVar1) {
    testing::Message::Message(local_a18);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_9d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x87f,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,local_a18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(local_a18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9d0);
  peVar2 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_50);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_a50,(CellmlElementType)peVar2);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_a30,"\"b4da5a\"","annotator->assignId(mapping)",
             (char (*) [7])"b4da5a",&local_a50);
  std::__cxx11::string::~string((string *)&local_a50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a30);
  if (!bVar1) {
    testing::Message::Message(local_a58);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_a30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x880,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,local_a58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(local_a58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a30);
  std::__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)local_888);
  libcellml::VariablePair::variable1();
  std::__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)local_888);
  libcellml::VariablePair::variable2();
  libcellml::Variable::equivalenceMappingId_abi_cxx11_
            ((shared_ptr *)&local_a90,(shared_ptr *)&local_aa0);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_a70,"\"b4da5a\"",
             "libcellml::Variable::equivalenceMappingId(mapping->variable1(), mapping->variable2())"
             ,(char (*) [7])"b4da5a",&local_a90);
  std::__cxx11::string::~string((string *)&local_a90);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_ab0);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_aa0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a70);
  if (!bVar1) {
    testing::Message::Message(local_ab8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_a70);
    testing::internal::AssertHelper::AssertHelper
              (local_ac0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x881,pcVar4);
    testing::internal::AssertHelper::operator=(local_ac0,local_ab8);
    testing::internal::AssertHelper::~AssertHelper(local_ac0);
    testing::Message::~Message(local_ab8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a70);
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_ae0,"changed",(allocator<char> *)((long)&gtest_ar_18.message_.ptr_ + 7));
  libcellml::Entity::setId((string *)peVar5);
  std::__cxx11::string::~string(local_ae0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_18.message_.ptr_ + 7));
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[8],std::__cxx11::string>
            ((EqHelper<false> *)local_af8,"\"changed\"","model->id()",(char (*) [8])"changed",
             &local_b18);
  std::__cxx11::string::~string((string *)&local_b18);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_af8);
  if (!bVar1) {
    testing::Message::Message(local_b20);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_af8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x884,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,local_b20);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(local_b20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_af8);
  peVar2 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_50);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_b58,(CellmlElementType)peVar2);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_b38,"\"b4da5b\"","annotator->assignId(model)",
             (char (*) [7])"b4da5b",&local_b58);
  std::__cxx11::string::~string((string *)&local_b58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b38);
  if (!bVar1) {
    testing::Message::Message(local_b60);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_b38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x885,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,local_b60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(local_b60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b38);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_b78,"\"b4da5b\"","model->id()",(char (*) [7])"b4da5b",
             &local_b98);
  std::__cxx11::string::~string((string *)&local_b98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b78);
  if (!bVar1) {
    testing::Message::Message(local_ba0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_b78);
    testing::internal::AssertHelper::AssertHelper
              (local_ba8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x886,pcVar4);
    testing::internal::AssertHelper::operator=(local_ba8,local_ba0);
    testing::internal::AssertHelper::~AssertHelper(local_ba8);
    testing::Message::~Message(local_ba0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b78);
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_be8,"component2",&local_be9);
  libcellml::ComponentEntity::component((string *)&local_bc8,SUB81(peVar5,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_bc8);
  libcellml::Component::reset((ulong)&local_bb8);
  peVar7 = std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_bb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c10,"changed",(allocator<char> *)((long)&gtest_ar_21.message_.ptr_ + 7));
  libcellml::Entity::setId((string *)peVar7);
  std::__cxx11::string::~string(local_c10);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_21.message_.ptr_ + 7));
  std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_bb8);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_bc8);
  std::__cxx11::string::~string(local_be8);
  std::allocator<char>::~allocator(&local_be9);
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c88,"component2",&local_c89);
  libcellml::ComponentEntity::component((string *)&local_c68,SUB81(peVar5,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_c68);
  libcellml::Component::reset((ulong)&local_c58);
  std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_c58);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[8],std::__cxx11::string>
            ((EqHelper<false> *)local_c28,"\"changed\"",
             "model->component(\"component2\")->reset(0)->id()",(char (*) [8])"changed",&local_c48);
  std::__cxx11::string::~string((string *)&local_c48);
  std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_c58);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_c68);
  std::__cxx11::string::~string(local_c88);
  std::allocator<char>::~allocator(&local_c89);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c28);
  if (!bVar1) {
    testing::Message::Message(local_c98);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_c28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x889,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,local_c98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(local_c98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c28);
  peVar2 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_50);
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d10,"component2",&local_d11);
  libcellml::ComponentEntity::component((string *)&local_cf0,SUB81(peVar5,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_cf0);
  libcellml::Component::reset((ulong)&local_ce0);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_cd0,(CellmlElementType)peVar2);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_cb0,"\"b4da5c\"",
             "annotator->assignId(model->component(\"component2\")->reset(0))",
             (char (*) [7])"b4da5c",&local_cd0);
  std::__cxx11::string::~string((string *)&local_cd0);
  std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_ce0);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_cf0);
  std::__cxx11::string::~string(local_d10);
  std::allocator<char>::~allocator(&local_d11);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cb0);
  if (!bVar1) {
    testing::Message::Message(local_d20);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_cb0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x88a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,local_d20);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(local_d20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cb0);
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d98,"component2",&local_d99);
  libcellml::ComponentEntity::component((string *)&local_d78,SUB81(peVar5,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_d78);
  libcellml::Component::reset((ulong)&local_d68);
  std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_d68);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_d38,"\"b4da5c\"",
             "model->component(\"component2\")->reset(0)->id()",(char (*) [7])"b4da5c",&local_d58);
  std::__cxx11::string::~string((string *)&local_d58);
  std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_d68);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_d78);
  std::__cxx11::string::~string(local_d98);
  std::allocator<char>::~allocator(&local_d99);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d38);
  if (!bVar1) {
    testing::Message::Message(local_da8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_d38);
    testing::internal::AssertHelper::AssertHelper
              (local_db0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x88b,pcVar4);
    testing::internal::AssertHelper::operator=(local_db0,local_da8);
    testing::internal::AssertHelper::~AssertHelper(local_db0);
    testing::Message::~Message(local_da8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d38);
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_df0,"component2",&local_df1);
  libcellml::ComponentEntity::component((string *)&local_dd0,SUB81(peVar5,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_dd0);
  libcellml::Component::reset((ulong)&local_dc0);
  peVar7 = std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_dc0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_e18,"changed",(allocator<char> *)((long)&gtest_ar_24.message_.ptr_ + 7));
  libcellml::Reset::setResetValueId((string *)peVar7);
  std::__cxx11::string::~string(local_e18);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_24.message_.ptr_ + 7));
  std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_dc0);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_dd0);
  std::__cxx11::string::~string(local_df0);
  std::allocator<char>::~allocator(&local_df1);
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e90,"component2",&local_e91);
  libcellml::ComponentEntity::component((string *)&local_e70,SUB81(peVar5,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_e70);
  libcellml::Component::reset((ulong)&local_e60);
  std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_e60);
  libcellml::Reset::resetValueId_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[8],std::__cxx11::string>
            ((EqHelper<false> *)local_e30,"\"changed\"",
             "model->component(\"component2\")->reset(0)->resetValueId()",(char (*) [8])"changed",
             &local_e50);
  std::__cxx11::string::~string((string *)&local_e50);
  std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_e60);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_e70);
  std::__cxx11::string::~string(local_e90);
  std::allocator<char>::~allocator(&local_e91);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e30);
  if (!bVar1) {
    testing::Message::Message(local_ea0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_e30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x88e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,local_ea0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
    testing::Message::~Message(local_ea0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e30);
  peVar2 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_50);
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f18,"component2",&local_f19);
  libcellml::ComponentEntity::component((string *)&local_ef8,SUB81(peVar5,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_ef8);
  libcellml::Component::reset((ulong)&local_ee8);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_ed8,(CellmlElementType)peVar2);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_eb8,"\"b4da5d\"",
             "annotator->assignId(model->component(\"component2\")->reset(0), libcellml::CellmlElementType::RESET_VALUE)"
             ,(char (*) [7])"b4da5d",&local_ed8);
  std::__cxx11::string::~string((string *)&local_ed8);
  std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_ee8);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_ef8);
  std::__cxx11::string::~string(local_f18);
  std::allocator<char>::~allocator(&local_f19);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_eb8);
  if (!bVar1) {
    testing::Message::Message(local_f28);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_eb8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_26.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x88f,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_26.message_,local_f28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_26.message_);
    testing::Message::~Message(local_f28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_eb8);
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_fa0,"component2",&local_fa1);
  libcellml::ComponentEntity::component((string *)&local_f80,SUB81(peVar5,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_f80);
  libcellml::Component::reset((ulong)&local_f70);
  std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_f70);
  libcellml::Reset::resetValueId_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_f40,"\"b4da5d\"",
             "model->component(\"component2\")->reset(0)->resetValueId()",(char (*) [7])"b4da5d",
             &local_f60);
  std::__cxx11::string::~string((string *)&local_f60);
  std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_f70);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_f80);
  std::__cxx11::string::~string(local_fa0);
  std::allocator<char>::~allocator(&local_fa1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f40);
  if (!bVar1) {
    testing::Message::Message(local_fb0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_f40);
    testing::internal::AssertHelper::AssertHelper
              (local_fb8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x890,pcVar4);
    testing::internal::AssertHelper::operator=(local_fb8,local_fb0);
    testing::internal::AssertHelper::~AssertHelper(local_fb8);
    testing::Message::~Message(local_fb0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f40);
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_ff8,"component2",&local_ff9);
  libcellml::ComponentEntity::component((string *)&local_fd8,SUB81(peVar5,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_fd8);
  libcellml::Component::reset((ulong)&local_fc8);
  peVar7 = std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_fc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1020,"changed",(allocator<char> *)((long)&gtest_ar_27.message_.ptr_ + 7));
  libcellml::Reset::setTestValueId((string *)peVar7);
  std::__cxx11::string::~string(local_1020);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_27.message_.ptr_ + 7));
  std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_fc8);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_fd8);
  std::__cxx11::string::~string(local_ff8);
  std::allocator<char>::~allocator(&local_ff9);
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1098,"component2",&local_1099);
  libcellml::ComponentEntity::component((string *)&local_1078,SUB81(peVar5,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_1078);
  libcellml::Component::reset((ulong)&local_1068);
  std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_1068);
  libcellml::Reset::testValueId_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[8],std::__cxx11::string>
            ((EqHelper<false> *)local_1038,"\"changed\"",
             "model->component(\"component2\")->reset(0)->testValueId()",(char (*) [8])"changed",
             &local_1058);
  std::__cxx11::string::~string((string *)&local_1058);
  std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_1068);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_1078);
  std::__cxx11::string::~string(local_1098);
  std::allocator<char>::~allocator(&local_1099);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1038);
  if (!bVar1) {
    testing::Message::Message(local_10a8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1038);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_28.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x893,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_28.message_,local_10a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_28.message_);
    testing::Message::~Message(local_10a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1038);
  peVar2 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_50);
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1120,"component2",&local_1121);
  libcellml::ComponentEntity::component((string *)&local_1100,SUB81(peVar5,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_1100);
  libcellml::Component::reset((ulong)&local_10f0);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_10e0,(CellmlElementType)peVar2);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_10c0,"\"b4da5e\"",
             "annotator->assignId(model->component(\"component2\")->reset(0), libcellml::CellmlElementType::TEST_VALUE)"
             ,(char (*) [7])"b4da5e",&local_10e0);
  std::__cxx11::string::~string((string *)&local_10e0);
  std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_10f0);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_1100);
  std::__cxx11::string::~string(local_1120);
  std::allocator<char>::~allocator(&local_1121);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10c0);
  if (!bVar1) {
    testing::Message::Message(local_1130);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_10c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x894,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29.message_,local_1130);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29.message_);
    testing::Message::~Message(local_1130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_10c0);
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_11a8,"component2",&local_11a9);
  libcellml::ComponentEntity::component((string *)&local_1188,SUB81(peVar5,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_1188);
  libcellml::Component::reset((ulong)&local_1178);
  std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_1178);
  libcellml::Reset::testValueId_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_1148,"\"b4da5e\"",
             "model->component(\"component2\")->reset(0)->testValueId()",(char (*) [7])"b4da5e",
             &local_1168);
  std::__cxx11::string::~string((string *)&local_1168);
  std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_1178);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_1188);
  std::__cxx11::string::~string(local_11a8);
  std::allocator<char>::~allocator(&local_11a9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1148);
  if (!bVar1) {
    testing::Message::Message(local_11b8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1148);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &unitsItem.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x895,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &unitsItem.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,local_11b8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &unitsItem.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    testing::Message::~Message(local_11b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1148);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  libcellml::Model::units((ulong)&local_11e0);
  libcellml::UnitsItem::create((shared_ptr *)local_11d0,(ulong)&local_11e0);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_11e0);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  libcellml::Model::units((ulong)&local_11f0);
  peVar8 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_11f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1210,"changed",(allocator<char> *)((long)&gtest_ar_30.message_.ptr_ + 7));
  libcellml::Units::setUnitId((ulong)peVar8,(string *)0x0);
  std::__cxx11::string::~string(local_1210);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_30.message_.ptr_ + 7));
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_11f0);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  libcellml::Model::units((ulong)&local_1258);
  std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_1258);
  libcellml::Units::unitId_abi_cxx11_((ulong)&local_1248);
  testing::internal::EqHelper<false>::Compare<char[8],std::__cxx11::string>
            ((EqHelper<false> *)local_1228,"\"changed\"","model->units(1)->unitId(0)",
             (char (*) [8])"changed",&local_1248);
  std::__cxx11::string::~string((string *)&local_1248);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_1258);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1228);
  if (!bVar1) {
    testing::Message::Message(local_1260);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1228);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_31.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x899,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_31.message_,local_1260);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_31.message_);
    testing::Message::~Message(local_1260);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1228);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_50);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_1298);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_1278,"\"b4da5f\"","annotator->assignId(unitsItem)",
             (char (*) [7])"b4da5f",&local_1298);
  std::__cxx11::string::~string((string *)&local_1298);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1278);
  if (!bVar1) {
    testing::Message::Message(local_12a0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1278);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_32.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x89a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_32.message_,local_12a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_32.message_);
    testing::Message::~Message(local_12a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1278);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  libcellml::Model::units((ulong)&local_12e8);
  std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_12e8);
  libcellml::Units::unitId_abi_cxx11_((ulong)&local_12d8);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_12b8,"\"b4da5f\"","model->units(1)->unitId(0)",
             (char (*) [7])"b4da5f",&local_12d8);
  std::__cxx11::string::~string((string *)&local_12d8);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_12e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_12b8);
  if (!bVar1) {
    testing::Message::Message(local_12f0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_12b8);
    testing::internal::AssertHelper::AssertHelper
              (local_12f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x89b,pcVar4);
    testing::internal::AssertHelper::operator=(local_12f8,local_12f0);
    testing::internal::AssertHelper::~AssertHelper(local_12f8);
    testing::Message::~Message(local_12f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_12b8);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  libcellml::Model::units((ulong)&local_1308);
  peVar8 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_1308);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1328,"changed",(allocator<char> *)((long)&gtest_ar_33.message_.ptr_ + 7));
  libcellml::Entity::setId((string *)peVar8);
  std::__cxx11::string::~string(local_1328);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_33.message_.ptr_ + 7));
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_1308);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  libcellml::Model::units((ulong)&local_1370);
  std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_1370);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[8],std::__cxx11::string>
            ((EqHelper<false> *)local_1340,"\"changed\"","model->units(1)->id()",
             (char (*) [8])"changed",&local_1360);
  std::__cxx11::string::~string((string *)&local_1360);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_1370);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1340);
  if (!bVar1) {
    testing::Message::Message(local_1378);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1340);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x89e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34.message_,local_1378);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34.message_);
    testing::Message::~Message(local_1378);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1340);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_50);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  libcellml::Model::units((ulong)&local_13c0);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_13b0);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_1390,"\"b4da60\"","annotator->assignId(model->units(1))",
             (char (*) [7])"b4da60",&local_13b0);
  std::__cxx11::string::~string((string *)&local_13b0);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_13c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1390);
  if (!bVar1) {
    testing::Message::Message(local_13c8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1390);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_35.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x89f,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_35.message_,local_13c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_35.message_);
    testing::Message::~Message(local_13c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1390);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  libcellml::Model::units((ulong)&local_1410);
  std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_1410);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_13e0,"\"b4da60\"","model->units(1)->id()",
             (char (*) [7])"b4da60",&local_1400);
  std::__cxx11::string::~string((string *)&local_1400);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_1410);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_13e0);
  if (!bVar1) {
    testing::Message::Message(local_1418);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_13e0);
    testing::internal::AssertHelper::AssertHelper
              (local_1420,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x8a0,pcVar4);
    testing::internal::AssertHelper::operator=(local_1420,local_1418);
    testing::internal::AssertHelper::~AssertHelper(local_1420);
    testing::Message::~Message(local_1418);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_13e0);
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1460,"component2",&local_1461);
  libcellml::ComponentEntity::component((string *)&local_1440,SUB81(peVar5,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_1440);
  libcellml::Component::variable((ulong)&local_1430);
  peVar9 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_1430);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1488,"changed",(allocator<char> *)((long)&gtest_ar_36.message_.ptr_ + 7));
  libcellml::Entity::setId((string *)peVar9);
  std::__cxx11::string::~string(local_1488);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_36.message_.ptr_ + 7));
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_1430);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_1440);
  std::__cxx11::string::~string(local_1460);
  std::allocator<char>::~allocator(&local_1461);
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1500,"component2",&local_1501);
  libcellml::ComponentEntity::component((string *)&local_14e0,SUB81(peVar5,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_14e0);
  libcellml::Component::variable((ulong)&local_14d0);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_14d0);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[8],std::__cxx11::string>
            ((EqHelper<false> *)local_14a0,"\"changed\"",
             "model->component(\"component2\")->variable(0)->id()",(char (*) [8])"changed",
             &local_14c0);
  std::__cxx11::string::~string((string *)&local_14c0);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_14d0);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_14e0);
  std::__cxx11::string::~string(local_1500);
  std::allocator<char>::~allocator(&local_1501);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_14a0);
  if (!bVar1) {
    testing::Message::Message(local_1510);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_14a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_37.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x8a3,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_37.message_,local_1510);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_37.message_);
    testing::Message::~Message(local_1510);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_14a0);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_50);
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1588,"component2",&local_1589);
  libcellml::ComponentEntity::component((string *)&local_1568,SUB81(peVar5,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_1568);
  libcellml::Component::variable((ulong)&local_1558);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_1548);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_1528,"\"b4da61\"",
             "annotator->assignId(model->component(\"component2\")->variable(0))",
             (char (*) [7])"b4da61",&local_1548);
  std::__cxx11::string::~string((string *)&local_1548);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_1558);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_1568);
  std::__cxx11::string::~string(local_1588);
  std::allocator<char>::~allocator(&local_1589);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1528);
  if (!bVar1) {
    testing::Message::Message(local_1598);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1528);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_38.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x8a4,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_38.message_,local_1598);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_38.message_);
    testing::Message::~Message(local_1598);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1528);
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1610,"component2",&local_1611);
  libcellml::ComponentEntity::component((string *)&local_15f0,SUB81(peVar5,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_15f0);
  libcellml::Component::variable((ulong)&local_15e0);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_15e0);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_15b0,"\"b4da61\"",
             "model->component(\"component2\")->variable(0)->id()",(char (*) [7])"b4da61",
             &local_15d0);
  std::__cxx11::string::~string((string *)&local_15d0);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_15e0);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_15f0);
  std::__cxx11::string::~string(local_1610);
  std::allocator<char>::~allocator(&local_1611);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_15b0);
  if (!bVar1) {
    testing::Message::Message(local_1620);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_15b0);
    testing::internal::AssertHelper::AssertHelper
              (local_1628,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x8a5,pcVar4);
    testing::internal::AssertHelper::operator=(local_1628,local_1620);
    testing::internal::AssertHelper::~AssertHelper(local_1628);
    testing::Message::~Message(local_1620);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_15b0);
  std::shared_ptr<libcellml::UnitsItem>::~shared_ptr((shared_ptr<libcellml::UnitsItem> *)local_11d0)
  ;
  std::shared_ptr<libcellml::VariablePair>::~shared_ptr
            ((shared_ptr<libcellml::VariablePair> *)local_888);
  std::shared_ptr<libcellml::VariablePair>::~shared_ptr
            ((shared_ptr<libcellml::VariablePair> *)local_350);
  std::shared_ptr<libcellml::Annotator>::~shared_ptr((shared_ptr<libcellml::Annotator> *)local_50);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_30);
  std::shared_ptr<libcellml::Parser>::~shared_ptr
            ((shared_ptr<libcellml::Parser> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Annotator, autoIdOnOutOfDateBuild)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(modelStringUniqueIds);
    auto annotator = libcellml::Annotator::create();

    annotator->setModel(model);

    model->component(0)->setId("changed");
    EXPECT_EQ("changed", model->component(0)->id());
    EXPECT_EQ("b4da55", annotator->assignId(model->component(0)));
    EXPECT_EQ("b4da55", model->component(0)->id());

    model->component("component2")->setEncapsulationId("changed");
    EXPECT_EQ("changed", model->component("component2")->encapsulationId());
    EXPECT_EQ("b4da56", annotator->assignId(model->component("component2"), libcellml::CellmlElementType::COMPONENT_REF));
    EXPECT_EQ("b4da56", model->component("component2")->encapsulationId());

    auto connection = libcellml::VariablePair::create(
        model->component("component2")->variable("variable1"),
        model->component("component2")->variable("variable1")->equivalentVariable(0));
    libcellml::Variable::setEquivalenceConnectionId(connection->variable1(), connection->variable2(), "changed");
    EXPECT_EQ("changed", libcellml::Variable::equivalenceConnectionId(connection->variable1(), connection->variable2()));
    EXPECT_EQ("b4da57", annotator->assignId(connection, libcellml::CellmlElementType::CONNECTION));
    EXPECT_EQ("b4da57", libcellml::Variable::equivalenceConnectionId(connection->variable1(), connection->variable2()));

    model->setEncapsulationId("changed");
    EXPECT_EQ("changed", model->encapsulationId());
    EXPECT_EQ("b4da58", annotator->assignId(model, libcellml::CellmlElementType::ENCAPSULATION));
    EXPECT_EQ("b4da58", model->encapsulationId());

    model->component("component1")->importSource()->setId("changed");
    EXPECT_EQ("changed", model->component("component1")->importSource()->id());
    EXPECT_EQ("b4da59", annotator->assignId(model->component("component1")->importSource()));
    EXPECT_EQ("b4da59", model->component("component1")->importSource()->id());

    auto mapping = libcellml::VariablePair::create(
        model->component("component2")->variable("variable2"),
        model->component("component2")->variable("variable2")->equivalentVariable(0));
    libcellml::Variable::setEquivalenceMappingId(mapping->variable1(), mapping->variable2(), "changed");
    EXPECT_EQ("changed", libcellml::Variable::equivalenceMappingId(mapping->variable1(), mapping->variable2()));
    EXPECT_EQ("b4da5a", annotator->assignId(mapping));
    EXPECT_EQ("b4da5a", libcellml::Variable::equivalenceMappingId(mapping->variable1(), mapping->variable2()));

    model->setId("changed");
    EXPECT_EQ("changed", model->id());
    EXPECT_EQ("b4da5b", annotator->assignId(model));
    EXPECT_EQ("b4da5b", model->id());

    model->component("component2")->reset(0)->setId("changed");
    EXPECT_EQ("changed", model->component("component2")->reset(0)->id());
    EXPECT_EQ("b4da5c", annotator->assignId(model->component("component2")->reset(0)));
    EXPECT_EQ("b4da5c", model->component("component2")->reset(0)->id());

    model->component("component2")->reset(0)->setResetValueId("changed");
    EXPECT_EQ("changed", model->component("component2")->reset(0)->resetValueId());
    EXPECT_EQ("b4da5d", annotator->assignId(model->component("component2")->reset(0), libcellml::CellmlElementType::RESET_VALUE));
    EXPECT_EQ("b4da5d", model->component("component2")->reset(0)->resetValueId());

    model->component("component2")->reset(0)->setTestValueId("changed");
    EXPECT_EQ("changed", model->component("component2")->reset(0)->testValueId());
    EXPECT_EQ("b4da5e", annotator->assignId(model->component("component2")->reset(0), libcellml::CellmlElementType::TEST_VALUE));
    EXPECT_EQ("b4da5e", model->component("component2")->reset(0)->testValueId());

    auto unitsItem = libcellml::UnitsItem::create(model->units(1), 0);
    model->units(1)->setUnitId(0, "changed");
    EXPECT_EQ("changed", model->units(1)->unitId(0));
    EXPECT_EQ("b4da5f", annotator->assignId(unitsItem));
    EXPECT_EQ("b4da5f", model->units(1)->unitId(0));

    model->units(1)->setId("changed");
    EXPECT_EQ("changed", model->units(1)->id());
    EXPECT_EQ("b4da60", annotator->assignId(model->units(1)));
    EXPECT_EQ("b4da60", model->units(1)->id());

    model->component("component2")->variable(0)->setId("changed");
    EXPECT_EQ("changed", model->component("component2")->variable(0)->id());
    EXPECT_EQ("b4da61", annotator->assignId(model->component("component2")->variable(0)));
    EXPECT_EQ("b4da61", model->component("component2")->variable(0)->id());
}